

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void init_me_luts(void)

{
  aom_bit_depth_t in_stack_00000008;
  int in_stack_0000000c;
  int *in_stack_00000010;
  
  init_me_luts_bd(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  init_me_luts_bd(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  init_me_luts_bd(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  return;
}

Assistant:

static void init_me_luts(void) {
  init_me_luts_bd(sad_per_bit_lut_8, QINDEX_RANGE, AOM_BITS_8);
  init_me_luts_bd(sad_per_bit_lut_10, QINDEX_RANGE, AOM_BITS_10);
  init_me_luts_bd(sad_per_bit_lut_12, QINDEX_RANGE, AOM_BITS_12);
}